

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O2

Rectangle * __thiscall
QPDFMatrix::transformRectangle(Rectangle *__return_storage_ptr__,QPDFMatrix *this,Rectangle r)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  reference pvVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var5;
  allocator_type local_61;
  double local_60;
  double local_58;
  vector<double,_std::allocator<double>_> ty;
  vector<double,_std::allocator<double>_> tx;
  
  std::vector<double,_std::allocator<double>_>::vector(&tx,4,(allocator_type *)&ty);
  std::vector<double,_std::allocator<double>_>::vector(&ty,4,&local_61);
  local_58 = r.lly;
  pvVar3 = std::vector<double,_std::allocator<double>_>::at(&tx,0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::at(&ty,0);
  transform(this,r.llx,local_58,pvVar3,pvVar4);
  local_60 = r.ury;
  pvVar3 = std::vector<double,_std::allocator<double>_>::at(&tx,1);
  pvVar4 = std::vector<double,_std::allocator<double>_>::at(&ty,1);
  transform(this,r.llx,local_60,pvVar3,pvVar4);
  pvVar3 = std::vector<double,_std::allocator<double>_>::at(&tx,2);
  pvVar4 = std::vector<double,_std::allocator<double>_>::at(&ty,2);
  transform(this,r.urx,local_58,pvVar3,pvVar4);
  pvVar3 = std::vector<double,_std::allocator<double>_>::at(&tx,3);
  pvVar4 = std::vector<double,_std::allocator<double>_>::at(&ty,3);
  transform(this,r.urx,local_60,pvVar3,pvVar4);
  _Var5 = std::
          __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (tx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     tx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  dVar1 = *_Var5._M_current;
  _Var5 = std::
          __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (ty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     ty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  local_58 = *_Var5._M_current;
  _Var5 = std::
          __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (tx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     tx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  local_60 = *_Var5._M_current;
  _Var5 = std::
          __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (ty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     ty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  dVar2 = *_Var5._M_current;
  __return_storage_ptr__->llx = dVar1;
  __return_storage_ptr__->lly = local_58;
  __return_storage_ptr__->urx = local_60;
  __return_storage_ptr__->ury = dVar2;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ty.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tx.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Rectangle
QPDFMatrix::transformRectangle(QPDFObjectHandle::Rectangle r) const
{
    std::vector<double> tx(4);
    std::vector<double> ty(4);
    transform(r.llx, r.lly, tx.at(0), ty.at(0));
    transform(r.llx, r.ury, tx.at(1), ty.at(1));
    transform(r.urx, r.lly, tx.at(2), ty.at(2));
    transform(r.urx, r.ury, tx.at(3), ty.at(3));
    return {
        *std::min_element(tx.begin(), tx.end()),
        *std::min_element(ty.begin(), ty.end()),
        *std::max_element(tx.begin(), tx.end()),
        *std::max_element(ty.begin(), ty.end())};
}